

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3 * rbuOpenDbhandle(sqlite3rbu *p,char *zName,int bUseVfs)

{
  int iVar1;
  char *pcVar2;
  char *local_40;
  sqlite3 *psStack_28;
  int flags;
  sqlite3 *db;
  char *pcStack_18;
  int bUseVfs_local;
  char *zName_local;
  sqlite3rbu *p_local;
  
  psStack_28 = (sqlite3 *)0x0;
  if (p->rc == 0) {
    if (bUseVfs == 0) {
      local_40 = (char *)0x0;
    }
    else {
      local_40 = p->zVfsName;
    }
    db._4_4_ = bUseVfs;
    pcStack_18 = zName;
    zName_local = (char *)p;
    iVar1 = sqlite3_open_v2(zName,&stack0xffffffffffffffd8,0x46,local_40);
    *(int *)(zName_local + 0x38) = iVar1;
    if (*(int *)(zName_local + 0x38) != 0) {
      pcVar2 = sqlite3_errmsg(psStack_28);
      pcVar2 = sqlite3_mprintf("%s",pcVar2);
      *(char **)(zName_local + 0x40) = pcVar2;
      sqlite3_close(psStack_28);
      psStack_28 = (sqlite3 *)0x0;
    }
  }
  return psStack_28;
}

Assistant:

static sqlite3 *rbuOpenDbhandle(
  sqlite3rbu *p, 
  const char *zName, 
  int bUseVfs
){
  sqlite3 *db = 0;
  if( p->rc==SQLITE_OK ){
    const int flags = SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE|SQLITE_OPEN_URI;
    p->rc = sqlite3_open_v2(zName, &db, flags, bUseVfs ? p->zVfsName : 0);
    if( p->rc ){
      p->zErrmsg = sqlite3_mprintf("%s", sqlite3_errmsg(db));
      sqlite3_close(db);
      db = 0;
    }
  }
  return db;
}